

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O0

int libtorrent::aux::anon_unknown_9::anti_leech_score(peer_connection *peer)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  torrent_info *ptVar4;
  undefined4 extraout_var;
  long *plVar5;
  long local_78;
  long local_70;
  int64_t have_size;
  int64_t local_60;
  long local_58;
  int64_t given_size;
  int64_t local_40;
  int64_t total_size;
  undefined1 local_28 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  peer_connection *peer_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peer;
  peer_connection::associated_torrent((peer_connection *)&total_size);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_28);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)&total_size);
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_28);
  ptVar4 = torrent::torrent_file(peVar3);
  local_40 = torrent_info::total_size(ptVar4);
  if (local_40 == 0) {
    peer_local._4_4_ = 0;
  }
  else {
    iVar1 = (*(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_vptr__Sp_counted_base[0xe])();
    local_60 = stat::total_payload_upload((stat *)CONCAT44(extraout_var,iVar1));
    have_size = local_40 / 2;
    plVar5 = ::std::min<long>(&local_60,&have_size);
    local_58 = *plVar5;
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    ptVar4 = torrent::torrent_file(peVar3);
    iVar1 = torrent_info::piece_length(ptVar4);
    iVar2 = peer_connection::num_have_pieces
                      ((peer_connection *)
                       t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    local_78 = (long)iVar1 * (long)iVar2;
    plVar5 = ::std::max<long>(&local_58,&local_78);
    local_70 = *plVar5;
    peer_local._4_4_ =
         ::std::abs((int)((long)((local_70 - ((ulong)(local_40 - (local_40 >> 0x3f)) >> 1)) * 2000)
                         / local_40));
  }
  given_size._0_4_ = 1;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_28);
  return peer_local._4_4_;
}

Assistant:

int anti_leech_score(peer_connection const* peer)
	{
		// the anti-leech seeding algorithm is based on the paper "Improving
		// BitTorrent: A Simple Approach" from Chow et. al. and ranks peers based
		// on how many pieces they have, preferring to unchoke peers that just
		// started and peers that are close to completing. Like this:
		//   ^
		//   | \                       / |
		//   |  \                     /  |
		//   |   \                   /   |
		// s |    \                 /    |
		// c |     \               /     |
		// o |      \             /      |
		// r |       \           /       |
		// e |        \         /        |
		//   |         \       /         |
		//   |          \     /          |
		//   |           \   /           |
		//   |            \ /            |
		//   |             V             |
		//   +---------------------------+
		//   0%    num have pieces     100%
		std::shared_ptr<torrent> const t = peer->associated_torrent().lock();
		TORRENT_ASSERT(t);

		std::int64_t const total_size = t->torrent_file().total_size();
		if (total_size == 0) return 0;
		// Cap the given_size so that it never causes the score to increase
		std::int64_t const given_size = std::min(peer->statistics().total_payload_upload()
			, total_size / 2);
		std::int64_t const have_size = std::max(given_size
			, std::int64_t(t->torrent_file().piece_length()) * peer->num_have_pieces());
		return int(std::abs((have_size - total_size / 2) * 2000 / total_size));
	}